

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::SetUsesMemory(WasmBytecodeGenerator *this,uint32 memoryIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsmJsFunctionInfo *pAVar4;
  WasmCompilationException *this_00;
  
  if (memoryIndex != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x86d,"(memoryIndex == 0)","memoryIndex == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((this->m_module->field_0x20 & 2) == 0) &&
     ((this->m_module->m_memImport).ptr == (WasmImport *)0x0)) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_00,L"unknown memory");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pAVar4 = Js::FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                     ((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  pAVar4->mUsesHeapBuffer = true;
  return;
}

Assistant:

void WasmBytecodeGenerator::SetUsesMemory(uint32 memoryIndex)
{
    // Only support one memory at this time
    Assert(memoryIndex == 0);
    if (!m_module->HasMemory() && !m_module->HasMemoryImport())
    {
        throw WasmCompilationException(_u("unknown memory"));
    }
    GetFunctionBody()->GetAsmJsFunctionInfo()->SetUsesHeapBuffer(true);
}